

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::ReturnStmt> __thiscall
mocker::Parser::returnStmt(Parser *this,TokIter *iter,TokIter end)

{
  bool bVar1;
  TokenID TVar2;
  pointer pTVar3;
  SyntaxError *this_00;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<mocker::ast::ReturnStmt> sVar5;
  Position end_00;
  Position end_01;
  Position beg;
  Position beg_00;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_160;
  pair<mocker::Position,_mocker::Position> local_158;
  size_t local_138;
  shared_ptr<mocker::ast::Expression> *psStack_130;
  Token *local_128;
  size_t sStack_120;
  pair<mocker::Position,_mocker::Position> local_118;
  Token *local_e8;
  undefined1 local_d8 [8];
  shared_ptr<mocker::ast::Expression> expr;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_c0;
  pair<mocker::Position,_mocker::Position> local_b8;
  size_t local_98;
  void **local_90;
  Token *local_88;
  size_t local_80;
  Token *local_78;
  Token *local_70;
  GetTokenID local_60;
  GetTokenID id;
  size_t local_50;
  undefined1 auStack_38 [8];
  Position begPos;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  begPos.col = (size_t)end._M_current;
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&id,pTVar3);
  auStack_38 = (undefined1  [8])id.end._M_current;
  begPos.line = local_50;
  GetTokenID::GetTokenID(&local_60,in_RCX);
  local_70 = *(Token **)begPos.col;
  TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_70);
  if (TVar2 == Return) {
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)begPos.col);
    local_78 = *(Token **)begPos.col;
    TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_78);
    if (TVar2 != Semicolon) {
      expression((Parser *)local_d8,iter,(TokIter)begPos.col);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
      if (bVar1) {
        local_e8 = *(Token **)begPos.col;
        TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_e8);
        if (TVar2 == Semicolon) {
          local_128 = (Token *)auStack_38;
          sStack_120 = begPos.line;
          local_160 = __gnu_cxx::
                      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                                    *)begPos.col,0);
          pTVar3 = __gnu_cxx::
                   __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                   ::operator->(&local_160);
          Token::position(&local_158,pTVar3);
          local_138 = local_158.second.line;
          psStack_130 = (shared_ptr<mocker::ast::Expression> *)local_158.second.col;
          end_01.col = local_158.second.line;
          end_01.line = sStack_120;
          beg_00.col = (size_t)local_128;
          beg_00.line = (size_t)iter;
          makeNode<mocker::ast::ReturnStmt,std::shared_ptr<mocker::ast::Expression>&>
                    (this,beg_00,end_01,(shared_ptr<mocker::ast::Expression> *)local_158.second.col)
          ;
          std::shared_ptr<mocker::ast::Expression>::~shared_ptr
                    ((shared_ptr<mocker::ast::Expression> *)local_d8);
          _Var4._M_pi = extraout_RDX_00;
          goto LAB_00256ba9;
        }
      }
      this_00 = (SyntaxError *)__cxa_allocate_exception(0x48);
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)begPos.col);
      Token::position(&local_118,pTVar3);
      SyntaxError::SyntaxError(this_00,(Position *)auStack_38,&local_118.second);
      __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    local_88 = (Token *)auStack_38;
    local_80 = begPos.line;
    local_c0 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)begPos.col,0);
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
             ::operator->(&local_c0);
    Token::position(&local_b8,pTVar3);
    local_98 = local_b8.second.line;
    local_90 = (void **)local_b8.second.col;
    expr.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    end_00.col = local_b8.second.line;
    end_00.line = local_80;
    beg.col = (size_t)local_88;
    beg.line = (size_t)iter;
    sVar5 = makeNode<mocker::ast::ReturnStmt,decltype(nullptr)>
                      (this,beg,end_00,(void **)local_b8.second.col);
    _Var4 = sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    std::shared_ptr<mocker::ast::ReturnStmt>::shared_ptr
              ((shared_ptr<mocker::ast::ReturnStmt> *)this,(nullptr_t)0x0);
    _Var4._M_pi = extraout_RDX;
  }
LAB_00256ba9:
  sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::ReturnStmt>)
         sVar5.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ReturnStmt> Parser::returnStmt(TokIter &iter,
                                                    TokIter end) {
  auto begPos = iter->position().first;

  auto id = GetTokenID(end);
  if (id(iter) != TokenID::Return)
    return nullptr;
  ++iter;
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::ReturnStmt>(begPos, (iter++)->position().second,
                                     nullptr);
  auto expr = expression(iter, end);
  if (!expr || id(iter) != TokenID::Semicolon)
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::ReturnStmt>(begPos, (iter++)->position().second, expr);
}